

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O3

void CB_EXPLORE::get_cover_probabilities
               (cb_explore *data,single_learner *param_2,example *ec,
               v_array<ACTION_SCORE::action_score> *probs)

{
  uint64_t *puVar1;
  uint32_t uVar2;
  ulong uVar3;
  learner<CB_EXPLORE::cb_explore,_example> *plVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  undefined4 in_XMM1_Db;
  action_score local_58;
  action_score *local_50;
  v_array<unsigned_int> *local_48;
  pointer_____offset_0x10___ *local_40;
  action_score *local_38;
  
  uVar3 = data->cover_size;
  local_48 = &data->preds;
  v_array<unsigned_int>::clear(local_48);
  if ((data->cbcs).num_actions == 0) {
    uVar6 = 0;
  }
  else {
    uVar8 = 0;
    do {
      local_58.score = 0.0;
      local_58.action = uVar8;
      v_array<ACTION_SCORE::action_score>::push_back(probs,&local_58);
      uVar8 = uVar8 + 1;
      uVar6 = (data->cbcs).num_actions;
    } while (uVar8 < uVar6);
  }
  if (data->cover_size != 0) {
    uVar9 = 0;
    do {
      plVar4 = data->cs;
      if (uVar9 == 0) {
        (**(code **)(plVar4 + 0x30))
                  (*(undefined8 *)(plVar4 + 0x18),*(undefined8 *)(plVar4 + 0x20),ec);
      }
      else {
        iVar10 = (int)uVar9 + 1;
        puVar1 = &(ec->super_example_predict).ft_offset;
        *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(plVar4 + 0xe0) * iVar10);
        (**(code **)(plVar4 + 0x30))
                  (*(undefined8 *)(plVar4 + 0x18),*(undefined8 *)(plVar4 + 0x20),ec);
        puVar1 = &(ec->super_example_predict).ft_offset;
        *puVar1 = *puVar1 - (ulong)(uint)(iVar10 * *(int *)(plVar4 + 0xe0));
      }
      uVar2 = (ec->pred).multiclass;
      uVar6 = uVar2 - 1;
      probs->_begin[uVar6].score = probs->_begin[uVar6].score + 1.0 / (float)uVar3;
      local_58.action = uVar2;
      v_array<unsigned_int>::push_back(local_48,&local_58.action);
      uVar9 = uVar9 + 1;
    } while (uVar9 < data->cover_size);
    uVar6 = (data->cbcs).num_actions;
  }
  fVar14 = (float)uVar6;
  lVar7 = (ulong)uVar6 * data->counter;
  auVar11._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar11._0_8_ = lVar7;
  auVar11._12_4_ = 0x45300000;
  auVar5._4_4_ = fVar14;
  auVar5._0_4_ = (float)SQRT((auVar11._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0));
  auVar5._8_4_ = 0;
  auVar5._12_4_ = in_XMM1_Db;
  auVar12 = divps(_DAT_0027a830,auVar5);
  if (auVar12._4_4_ <= auVar12._0_4_) {
    auVar12._0_4_ = auVar12._4_4_;
  }
  auVar13._4_12_ = auVar12._4_12_;
  auVar13._0_4_ = auVar12._0_4_ * fVar14;
  local_50 = probs->_begin;
  local_38 = probs->_end;
  local_58 = (action_score)
             &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_40 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>(auVar13._0_8_,0);
  data->counter = data->counter + 1;
  return;
}

Assistant:

void get_cover_probabilities(cb_explore& data, single_learner& /* base */, example& ec, v_array<action_score>& probs)
{
  float additive_probability = 1.f / (float)data.cover_size;
  data.preds.clear();

  for (uint32_t i = 0; i < data.cbcs.num_actions; i++) probs.push_back({i, 0.});

  for (size_t i = 0; i < data.cover_size; i++)
  {
    // get predicted cost-sensitive predictions
    if (i == 0)
      data.cs->predict(ec, i);
    else
      data.cs->predict(ec, i + 1);
    uint32_t pred = ec.pred.multiclass;
    probs[pred - 1].score += additive_probability;
    data.preds.push_back((uint32_t)pred);
  }
  uint32_t num_actions = data.cbcs.num_actions;

  float min_prob = min(1.f / num_actions, 1.f / (float)sqrt(data.counter * num_actions));

  enforce_minimum_probability(min_prob * num_actions, false, begin_scores(probs), end_scores(probs));

  data.counter++;
}